

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int l_strcmp(TString *ls,TString *rs)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  TString *__s2;
  uint unaff_EBP;
  size_t sVar4;
  TString *__s1;
  size_t sVar5;
  
  sVar5 = (ls->tsv).len;
  __s1 = ls + 1;
  sVar4 = (rs->tsv).len;
  __s2 = rs + 1;
  do {
    uVar2 = strcoll((char *)__s1,(char *)__s2);
    if (uVar2 == 0) {
      sVar3 = strlen((char *)__s1);
      if (sVar3 == sVar4) {
        unaff_EBP = (uint)(sVar3 != sVar5);
      }
      else {
        if (sVar3 != sVar5) {
          __s1 = (TString *)((long)__s1 + sVar3 + 1);
          sVar5 = sVar5 - (sVar3 + 1);
          __s2 = (TString *)((long)__s2 + sVar3 + 1);
          sVar4 = sVar4 - (sVar3 + 1);
          bVar1 = true;
          goto LAB_001080a5;
        }
        unaff_EBP = 0xffffffff;
      }
      bVar1 = false;
    }
    else {
      bVar1 = false;
      unaff_EBP = uVar2;
    }
LAB_001080a5:
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static int l_strcmp(const TString*ls,const TString*rs){
const char*l=getstr(ls);
size_t ll=ls->tsv.len;
const char*r=getstr(rs);
size_t lr=rs->tsv.len;
for(;;){
int temp=strcoll(l,r);
if(temp!=0)return temp;
else{
size_t len=strlen(l);
if(len==lr)
return(len==ll)?0:1;
else if(len==ll)
return-1;
len++;
l+=len;ll-=len;r+=len;lr-=len;
}
}
}